

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.cc
# Opt level: O2

void absl::StrAppend(string *dest,AlphaNum *a,AlphaNum *b)

{
  pointer pcVar1;
  size_t __n;
  size_t __n_00;
  ulong uVar2;
  pointer __dest;
  
  if (((a->piece_).length_ != 0) &&
     ((ulong)((long)(a->piece_).ptr_ - (long)(dest->_M_dataplus)._M_p) <= dest->_M_string_length)) {
    __assert_fail("((a).size() == 0) || (uintptr_t((a).data() - (*dest).data()) > uintptr_t((*dest).size()))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/strings/str_cat.cc"
                  ,0xc2,"void absl::StrAppend(string *, const AlphaNum &, const AlphaNum &)");
  }
  if ((b->piece_).length_ == 0) {
    uVar2 = dest->_M_string_length;
  }
  else {
    uVar2 = dest->_M_string_length;
    if ((ulong)((long)(b->piece_).ptr_ - (long)(dest->_M_dataplus)._M_p) <= uVar2) {
      __assert_fail("((b).size() == 0) || (uintptr_t((b).data() - (*dest).data()) > uintptr_t((*dest).size()))"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/strings/str_cat.cc"
                    ,0xc3,"void absl::StrAppend(string *, const AlphaNum &, const AlphaNum &)");
    }
  }
  std::__cxx11::string::resize((ulong)dest);
  pcVar1 = (dest->_M_dataplus)._M_p;
  __dest = pcVar1 + uVar2;
  __n = (a->piece_).length_;
  memcpy(__dest,(a->piece_).ptr_,__n);
  __n_00 = (b->piece_).length_;
  memcpy(__dest + __n,(b->piece_).ptr_,__n_00);
  if (__dest + __n + __n_00 == pcVar1 + dest->_M_string_length) {
    return;
  }
  __assert_fail("out == begin + dest->size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/strings/str_cat.cc"
                ,0xcb,"void absl::StrAppend(string *, const AlphaNum &, const AlphaNum &)");
}

Assistant:

void StrAppend(string* dest, const AlphaNum& a, const AlphaNum& b) {
  ASSERT_NO_OVERLAP(*dest, a);
  ASSERT_NO_OVERLAP(*dest, b);
  string::size_type old_size = dest->size();
  strings_internal::STLStringResizeUninitialized(
      dest, old_size + a.size() + b.size());
  char* const begin = &*dest->begin();
  char* out = begin + old_size;
  out = Append(out, a);
  out = Append(out, b);
  assert(out == begin + dest->size());
}